

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExecutionQueue.cpp
# Opt level: O3

bool __thiscall
llbuild::basic::ExecutionQueue::executeShellCommand
          (ExecutionQueue *this,QueueJobContext *context,StringRef command)

{
  char *pcVar1;
  size_t sVar2;
  ProcessStatus PVar3;
  char *__s;
  size_t sVar4;
  StringRef *pSVar5;
  ArrayRef<llvm::StringRef> commandLine;
  SmallString<1024U> commandStorage;
  SmallString<1024U> local_440;
  
  local_440.super_SmallVector<char,_1024U>.super_SmallVectorImpl<char>.
  super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
  super_SmallVectorBase.BeginX =
       &local_440.super_SmallVector<char,_1024U>.super_SmallVectorStorage<char,_1024U>;
  local_440.super_SmallVector<char,_1024U>.super_SmallVectorImpl<char>.
  super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
  super_SmallVectorBase.Size = 0;
  local_440.super_SmallVector<char,_1024U>.super_SmallVectorImpl<char>.
  super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
  super_SmallVectorBase.Capacity = 0x400;
  llvm::SmallVectorImpl<char>::append<char_const*,void>
            ((SmallVectorImpl<char> *)&local_440,command.Data,command.Data + command.Length);
  sVar2 = DAT_00241c80;
  pcVar1 = basic::DefaultShellPath_abi_cxx11_;
  __s = llvm::SmallString<1024U>::c_str(&local_440);
  if (__s == (char *)0x0) {
    sVar4 = 0;
  }
  else {
    sVar4 = strlen(__s);
  }
  pSVar5 = (StringRef *)operator_new(0x30);
  pSVar5->Data = pcVar1;
  pSVar5->Length = sVar2;
  pSVar5[1].Data = "-c";
  pSVar5[1].Length = 2;
  pSVar5[2].Data = __s;
  pSVar5[2].Length = sVar4;
  commandLine.Length = 3;
  commandLine.Data = pSVar5;
  PVar3 = executeProcess(this,context,commandLine);
  operator_delete(pSVar5,0x30);
  if ((SmallVectorStorage<char,_1024U> *)
      local_440.super_SmallVector<char,_1024U>.super_SmallVectorImpl<char>.
      super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
      super_SmallVectorBase.BeginX !=
      &local_440.super_SmallVector<char,_1024U>.super_SmallVectorStorage<char,_1024U>) {
    free(local_440.super_SmallVector<char,_1024U>.super_SmallVectorImpl<char>.
         super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
         super_SmallVectorBase.BeginX);
  }
  return PVar3 == Succeeded;
}

Assistant:

bool ExecutionQueue::executeShellCommand(QueueJobContext* context,
                                         StringRef command) {
  SmallString<1024> commandStorage(command);
  std::vector<StringRef> commandLine(
#if defined(_WIN32)
      {"C:\\windows\\system32\\cmd.exe", "/C", commandStorage.c_str()});
#else
      {DefaultShellPath, "-c", commandStorage.c_str()});
#endif
  return executeProcess(context, commandLine) == ProcessStatus::Succeeded;
}

ExecutionQueueDelegate::~ExecutionQueueDelegate() {
}